

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall crnlib::symbol_codec::decode(symbol_codec *this,adaptive_arith_data_model *model)

{
  uint uVar1;
  adaptive_bit_model *model_00;
  uint local_1c;
  uint bit;
  uint node;
  adaptive_arith_data_model *model_local;
  symbol_codec *this_local;
  
  local_1c = 1;
  do {
    model_00 = vector<crnlib::adaptive_bit_model>::operator[](&model->m_probs,local_1c);
    uVar1 = decode(this,model_00,true);
    local_1c = local_1c * 2 + uVar1;
  } while (local_1c < model->m_total_syms);
  return local_1c - model->m_total_syms;
}

Assistant:

uint symbol_codec::decode(adaptive_arith_data_model& model) {
  uint node = 1;

  do {
    uint bit = decode(model.m_probs[node]);

    node = (node << 1) + bit;

  } while (node < model.m_total_syms);

  return node - model.m_total_syms;
}